

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

int Abc_DecTest(char *pFileName,int DecType,int nVarNum,int fVerbose)

{
  int fVerbose_local;
  int nVarNum_local;
  int DecType_local;
  char *pFileName_local;
  
  if (fVerbose != 0) {
    printf("Using truth tables from file \"%s\"...\n",pFileName);
  }
  if (DecType == 0) {
    if (nVarNum < 0) {
      Abc_TtStoreTest(pFileName);
    }
  }
  else if ((DecType < 1) || (5 < DecType)) {
    printf("Unknown decomposition type value (%d).\n",(ulong)(uint)DecType);
  }
  else {
    Abc_TruthDecTest(pFileName,DecType,nVarNum,fVerbose);
  }
  fflush(_stdout);
  return 0;
}

Assistant:

int Abc_DecTest( char * pFileName, int DecType, int nVarNum, int fVerbose )
{
    if ( fVerbose )
        printf( "Using truth tables from file \"%s\"...\n", pFileName );
    if ( DecType == 0 )
        { if ( nVarNum < 0 ) Abc_TtStoreTest( pFileName ); }
    else if ( DecType >= 1 && DecType <= 5 )
        Abc_TruthDecTest( pFileName, DecType, nVarNum, fVerbose );
    else
        printf( "Unknown decomposition type value (%d).\n", DecType );
    fflush( stdout );
    return 0;
}